

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_setopt(CURLM *multi_handle,CURLMoption option,...)

{
  CURLMcode CVar1;
  va_list param;
  char **local_a8;
  
  CVar1 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    CVar1 = CURLM_UNKNOWN_OPTION;
    if ((int)option < 0x271b) {
      switch(option) {
      case CURLMOPT_PIPELINING:
        *(char ***)((long)multi_handle + 0xb8) = local_a8;
        break;
      case 4:
      case 5:
      case 9:
      case 10:
      case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_PIPELINING:
      case 0xc:
        goto switchD_004c255a_caseD_4;
      case CURLMOPT_MAXCONNECTS:
        *(char ***)((long)multi_handle + 0x120) = local_a8;
        break;
      case CURLMOPT_MAX_HOST_CONNECTIONS:
        *(char ***)((long)multi_handle + 0x128) = local_a8;
        break;
      case CURLMOPT_MAX_PIPELINE_LENGTH:
        *(char ***)((long)multi_handle + 0x138) = local_a8;
        break;
      case CURLMOPT_MAX_TOTAL_CONNECTIONS:
        *(char ***)((long)multi_handle + 0x130) = local_a8;
        break;
      default:
        if (option == CURLMOPT_SOCKETDATA) {
          *(char ***)((long)multi_handle + 0x38) = local_a8;
        }
        else {
          if (option != CURLMOPT_TIMERDATA) {
            return CURLM_UNKNOWN_OPTION;
          }
          *(char ***)((long)multi_handle + 0x168) = local_a8;
        }
      }
    }
    else if ((int)option < 0x4e24) {
      if ((int)option < 0x271f) {
        if (option == CURLMOPT_PIPELINING_SITE_BL) {
          CVar1 = Curl_pipeline_set_site_blacklist
                            (local_a8,(curl_llist **)((long)multi_handle + 0x150));
          return CVar1;
        }
        if (option != CURLMOPT_PIPELINING_SERVER_BL) {
          return CURLM_UNKNOWN_OPTION;
        }
        CVar1 = Curl_pipeline_set_server_blacklist
                          (local_a8,(curl_llist **)((long)multi_handle + 0x158));
        return CVar1;
      }
      if (option == CURLMOPT_PUSHDATA) {
        *(char ***)((long)multi_handle + 0x48) = local_a8;
      }
      else {
        if (option != CURLMOPT_SOCKETFUNCTION) {
          return CURLM_UNKNOWN_OPTION;
        }
        *(char ***)((long)multi_handle + 0x30) = local_a8;
      }
    }
    else if ((int)option < 0x7539) {
      if (option == CURLMOPT_TIMERFUNCTION) {
        *(char ***)((long)multi_handle + 0x160) = local_a8;
      }
      else {
        if (option != CURLMOPT_PUSHFUNCTION) {
          return CURLM_UNKNOWN_OPTION;
        }
        *(char ***)((long)multi_handle + 0x40) = local_a8;
      }
    }
    else if (option == CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE) {
      *(char ***)((long)multi_handle + 0x140) = local_a8;
    }
    else {
      if (option != CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE) {
        return CURLM_UNKNOWN_OPTION;
      }
      *(char ***)((long)multi_handle + 0x148) = local_a8;
    }
    CVar1 = CURLM_OK;
  }
switchD_004c255a_caseD_4:
  return CVar1;
}

Assistant:

CURLMcode curl_multi_setopt(CURLM *multi_handle,
                            CURLMoption option, ...)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  CURLMcode res = CURLM_OK;
  va_list param;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->pipelining = va_arg(param, long);
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    multi->maxconnects = va_arg(param, long);
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    multi->max_pipeline_length = va_arg(param, long);
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    multi->content_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    multi->chunk_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    res = Curl_pipeline_set_site_blacklist(va_arg(param, char **),
                                           &multi->pipelining_site_bl);
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    res = Curl_pipeline_set_server_blacklist(va_arg(param, char **),
                                             &multi->pipelining_server_bl);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}